

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

SourceContextInfo * __thiscall
Js::ScriptContext::GetSourceContextInfo
          (ScriptContext *this,DWORD_PTR sourceContext,SimpleDataCacheWrapper *dataCacheWrapper)

{
  bool bVar1;
  Cache *pCVar2;
  SourceContextInfo **ppSVar3;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  SourceDynamicProfileManager **ppSVar4;
  SourceDynamicProfileManager *pSVar5;
  ScriptContext *pSStack_30;
  bool profileLoaded;
  SourceContextInfo *sourceContextInfo;
  SimpleDataCacheWrapper *dataCacheWrapper_local;
  DWORD_PTR sourceContext_local;
  ScriptContext *this_local;
  
  sourceContextInfo = (SourceContextInfo *)dataCacheWrapper;
  dataCacheWrapper_local = (SimpleDataCacheWrapper *)sourceContext;
  sourceContext_local = (DWORD_PTR)this;
  if (sourceContext == 0xffffffffffffffff) {
    pCVar2 = Cache(this);
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                        ((WriteBarrierPtr *)&pCVar2->noContextSourceContextInfo);
    this_local = (ScriptContext *)*ppSVar3;
  }
  else {
    EnsureSourceContextInfoMap(this);
    pSStack_30 = (ScriptContext *)0x0;
    pCVar2 = Cache(this);
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&pCVar2->sourceContextInfoMap);
    bVar1 = JsUtil::
            BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_long>
                      (this_00,(unsigned_long *)&dataCacheWrapper_local,
                       (SourceContextInfo **)&stack0xffffffffffffffd0);
    if (bVar1) {
      if ((sourceContextInfo != (SourceContextInfo *)0x0) &&
         (ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                              ((WriteBarrierPtr *)&pSStack_30->next),
         *ppSVar4 != (SourceDynamicProfileManager *)0x0)) {
        pSVar5 = Memory::WriteBarrierPtr<Js::SourceDynamicProfileManager>::operator->
                           ((WriteBarrierPtr<Js::SourceDynamicProfileManager> *)&pSStack_30->next);
        bVar1 = SourceDynamicProfileManager::IsProfileLoadedFromWinInet(pSVar5);
        if ((!bVar1) && ((this->startupComplete & 1U) == 0)) {
          pSVar5 = Memory::WriteBarrierPtr<Js::SourceDynamicProfileManager>::operator->
                             ((WriteBarrierPtr<Js::SourceDynamicProfileManager> *)&pSStack_30->next)
          ;
          SourceDynamicProfileManager::LoadFromProfileCache
                    (pSVar5,(SimpleDataCacheWrapper *)sourceContextInfo,
                     (LPCWSTR)(pSStack_30->super_ScriptContextBase).pActiveScriptDirect);
        }
      }
      this_local = pSStack_30;
    }
    else {
      this_local = (ScriptContext *)0x0;
    }
  }
  return (SourceContextInfo *)this_local;
}

Assistant:

SourceContextInfo *  ScriptContext::GetSourceContextInfo(DWORD_PTR sourceContext, SimpleDataCacheWrapper* dataCacheWrapper)
    {
        if (sourceContext == Js::Constants::NoHostSourceContext)
        {
            return this->Cache()->noContextSourceContextInfo;
        }

        // We only init sourceContextInfoMap, don't need to lock.
        EnsureSourceContextInfoMap();
        SourceContextInfo * sourceContextInfo = nullptr;
        if (this->Cache()->sourceContextInfoMap->TryGetValue(sourceContext, &sourceContextInfo))
        {
#if ENABLE_PROFILE_INFO
            if (dataCacheWrapper &&
                sourceContextInfo->sourceDynamicProfileManager != nullptr &&
                !sourceContextInfo->sourceDynamicProfileManager->IsProfileLoadedFromWinInet() &&
                !this->startupComplete)
            {
                bool profileLoaded = sourceContextInfo->sourceDynamicProfileManager->LoadFromProfileCache(dataCacheWrapper, sourceContextInfo->url);
                if (profileLoaded)
                {
                    JS_ETW(EventWriteJSCRIPT_PROFILE_LOAD(sourceContextInfo->dwHostSourceContext, this));
                }
            }
#endif
            return sourceContextInfo;
        }
        return nullptr;
    }